

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O0

void beltHMACStart(void *state,octet *key,size_t len)

{
  ulong in_RDX;
  undefined8 *in_RSI;
  u32 *in_RDI;
  belt_hmac_st *st;
  void *in_stack_ffffffffffffffc8;
  u32 *src;
  u32 *in_stack_ffffffffffffffd0;
  u32 *dest;
  u32 *in_stack_ffffffffffffffd8;
  ulong local_18;
  undefined8 *local_10;
  
  if (in_RDX < 0x21) {
    memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x1735e0);
    memSet(in_stack_ffffffffffffffd0,(octet)((ulong)in_stack_ffffffffffffffc8 >> 0x38),0x173602);
  }
  else {
    in_RDI[0] = 0;
    in_RDI[1] = 0;
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    beltBlockAddBitSizeU32(in_RDI,in_RDX);
    in_RDI[4] = 0;
    in_RDI[5] = 0;
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    in_stack_ffffffffffffffd8 = in_RDI + 8;
    beltH();
    u32From(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x173670);
    local_10 = in_RSI;
    for (local_18 = in_RDX; 0x1f < local_18; local_18 = local_18 - 0x20) {
      *(undefined8 *)(in_RDI + 0x34) = *local_10;
      *(undefined8 *)(in_RDI + 0x36) = local_10[1];
      *(undefined8 *)(in_RDI + 0x38) = local_10[2];
      *(undefined8 *)(in_RDI + 0x3a) = local_10[3];
      beltCompr2(in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
      local_10 = local_10 + 4;
    }
    if (local_18 != 0) {
      memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x173742);
      memSet(in_stack_ffffffffffffffd0,(octet)((ulong)in_stack_ffffffffffffffc8 >> 0x38),0x173764);
      beltCompr2(in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
    }
    beltCompr(in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    *(undefined8 *)(in_RDI + 0x34) = *(undefined8 *)(in_RDI + 8);
    *(undefined8 *)(in_RDI + 0x36) = *(undefined8 *)(in_RDI + 10);
    *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0xc);
    *(undefined8 *)(in_RDI + 0x3a) = *(undefined8 *)(in_RDI + 0xe);
  }
  for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
    *(byte *)((long)in_RDI + local_18 + 0xd0) = *(byte *)((long)in_RDI + local_18 + 0xd0) ^ 0x36;
  }
  in_RDI[0] = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  beltBlockAddBitSizeU32(in_RDI,0x20);
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  dest = in_RDI + 8;
  beltH();
  u32From(dest,in_stack_ffffffffffffffc8,0x1738ac);
  beltCompr2(in_RDI,in_stack_ffffffffffffffd8,dest,in_stack_ffffffffffffffc8);
  in_RDI[0x3c] = 0;
  in_RDI[0x3d] = 0;
  while (local_18 != 0) {
    *(byte *)((long)in_RDI + local_18 + 0xcf) = *(byte *)((long)in_RDI + local_18 + 0xcf) ^ 0x6a;
    local_18 = local_18 - 1;
  }
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  beltBlockAddBitSizeU32(in_RDI + 0x18,0x40);
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  src = in_RDI + 0x20;
  beltH();
  u32From(dest,src,0x17398e);
  beltCompr2(in_RDI,in_stack_ffffffffffffffd8,dest,src);
  return;
}

Assistant:

void beltHMACStart(void* state, const octet key[], size_t len)
{
	belt_hmac_st* st = (belt_hmac_st*)state;
	ASSERT(memIsDisjoint2(key, len, state, beltHMAC_keep()));
	// key <- key || 0
	if (len <= 32)
	{
		memCopy(st->block, key, len);
		memSetZero(st->block + len, 32 - len);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
	}
	// key <- beltHash(key)
	else
	{
		beltBlockSetZero(st->ls_in);
		beltBlockAddBitSizeU32(st->ls_in, len);
		beltBlockSetZero(st->ls_in + 4);
		u32From(st->h_in, beltH(), 32);
		while (len >= 32)
		{
			beltBlockCopy(st->block, key);
			beltBlockCopy(st->block + 16, key + 16);
#if (OCTET_ORDER == BIG_ENDIAN)
			beltBlockRevU32(st->block);
			beltBlockRevU32(st->block + 16);
#endif
			beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
			key += 32;
			len -= 32;
		}
		if (len)
		{
			memCopy(st->block, key, len);
			memSetZero(st->block + len, 32 - len);
#if (OCTET_ORDER == BIG_ENDIAN)
			beltBlockRevU32(st->block);
			beltBlockRevU32(st->block + 16);
#endif
			beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
		}
		beltCompr(st->h_in, st->ls_in, st->stack);
		beltBlockCopy(st->block, st->h_in);
		beltBlockCopy(st->block + 16, st->h_in + 4);
	}
	// сформировать key ^ ipad
	for (len = 0; len < 32; ++len)
		st->block[len] ^= 0x36;
	// начать внутреннее хэширование
	beltBlockSetZero(st->ls_in);
	beltBlockAddBitSizeU32(st->ls_in, 32);
	beltBlockSetZero(st->ls_in + 4);
	u32From(st->h_in, beltH(), 32);
	beltCompr2(st->ls_in + 4, st->h_in, (u32*)st->block, st->stack);
	st->filled = 0;
	// сформировать key ^ opad [0x36 ^ 0x5C == 0x6A]
	for (; len--; )
		st->block[len] ^= 0x6A;
	// начать внешнее хэширование [будет хэшироваться ровно два блока]
	beltBlockSetZero(st->ls_out);
	beltBlockAddBitSizeU32(st->ls_out, 32 * 2);
	beltBlockSetZero(st->ls_out + 4);
	u32From(st->h_out, beltH(), 32);
	beltCompr2(st->ls_out + 4, st->h_out, (u32*)st->block, st->stack);
}